

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSimSat.c
# Opt level: O2

void Ssw_ManResimulateBit(Ssw_Man_t *p,Aig_Obj_t *pCand,Aig_Obj_t *pRepr)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  void *pvVar5;
  Aig_Man_t *pAVar6;
  abctime aVar7;
  uint uVar8;
  int iVar9;
  char *__assertion;
  
  aVar4 = Abc_Clock();
  puVar1 = &p->pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  uVar8 = 0;
  while( true ) {
    pAVar6 = p->pAig;
    if (pAVar6->vCis->nSize <= (int)uVar8) break;
    pvVar5 = Vec_PtrEntry(pAVar6->vCis,uVar8);
    *(ulong *)((long)pvVar5 + 0x18) =
         *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf |
         (ulong)((p->pPatWords[uVar8 >> 5] >> ((byte)uVar8 & 0x1f) & 1) << 5);
    uVar8 = uVar8 + 1;
  }
  for (iVar9 = 0; iVar9 < pAVar6->vObjs->nSize; iVar9 = iVar9 + 1) {
    pvVar5 = Vec_PtrEntry(pAVar6->vObjs,iVar9);
    if ((pvVar5 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7)) {
      *(ulong *)((long)pvVar5 + 0x18) =
           *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf |
           (ulong)((((uint)*(ulong *)((long)pvVar5 + 0x10) ^
                    *(uint *)((*(ulong *)((long)pvVar5 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5) &
                    ((uint)*(ulong *)((long)pvVar5 + 8) ^
                    *(uint *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18) >> 5) & 1)
                  << 5);
    }
    pAVar6 = p->pAig;
  }
  if (pRepr != (Aig_Obj_t *)0x0) {
    iVar9 = Ssw_ClassesRefineConst1(p->ppClasses,0);
    iVar2 = Ssw_ClassesRefine(p->ppClasses,0);
    iVar3 = Aig_ObjIsConst1(pRepr);
    if (iVar3 == 0) {
      if (iVar2 != 0) goto LAB_005173d8;
      __assertion = "RetValue2";
      uVar8 = 0x49;
    }
    else {
      if (iVar9 != 0) goto LAB_005173d8;
      __assertion = "RetValue1";
      uVar8 = 0x43;
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSimSat.c"
                  ,uVar8,"void Ssw_ManResimulateBit(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
LAB_005173d8:
  aVar7 = Abc_Clock();
  p->timeSimSat = p->timeSimSat + (aVar7 - aVar4);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Handle the counter-example.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManResimulateBit( Ssw_Man_t * p, Aig_Obj_t * pCand, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // set the PI simulation information
    Aig_ManConst1(p->pAig)->fMarkB = 1;
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, i );
    // simulate internal nodes
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                     & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
    // if repr is given, perform refinement
    if ( pRepr )
    {
        // check equivalence classes
        RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
        RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        // make sure refinement happened
        if ( Aig_ObjIsConst1(pRepr) )
        {
            assert( RetValue1 );
            if ( RetValue1 == 0 )
                Abc_Print( 1, "\nSsw_ManResimulateBit() Error: RetValue1 does not hold.\n" );
        }
        else
        {
            assert( RetValue2 );
            if ( RetValue2 == 0 )
                Abc_Print( 1, "\nSsw_ManResimulateBit() Error: RetValue2 does not hold.\n" );
        }
    }
p->timeSimSat += Abc_Clock() - clk;
}